

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void_t<typename_unique_ptr<Person>::element_type>
mserialize::detail::BuiltinDeserializer<std::unique_ptr<Person,std::default_delete<Person>>,void>::
make_nonempty<std::unique_ptr<Person,std::default_delete<Person>>>
          (unique_ptr<Person,_std::default_delete<Person>_> *ptr)

{
  Person *__ptr;
  Person *pPVar1;
  
  pPVar1 = (Person *)operator_new(0x28);
  pPVar1->age = 0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  __ptr = (ptr->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
          super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
          super__Head_base<0UL,_Person_*,_false>._M_head_impl;
  (ptr->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
  super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
  super__Head_base<0UL,_Person_*,_false>._M_head_impl = pPVar1;
  if (__ptr != (Person *)0x0) {
    std::default_delete<Person>::operator()((default_delete<Person> *)ptr,__ptr);
    return;
  }
  return;
}

Assistant:

static void_t<typename SmartPtr::element_type> make_nonempty(SmartPtr& ptr)
  {
    using T = typename SmartPtr::element_type;
    ptr.reset(new T{}); // NOLINT(cppcoreguidelines-owning-memory)
  }